

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O1

void cmDyndepCollation::AddCollationInformation
               (Value *tdi,cmGeneratorTarget *gt,string *config,cmDyndepGeneratorCallbacks *cb)

{
  _Base_ptr *pp_Var1;
  cmTarget *pcVar2;
  pointer pcVar3;
  pointer puVar4;
  cmInstallGenerator *pcVar5;
  _Base_ptr p_Var6;
  cmGeneratorTarget *pcVar7;
  cmMakefile *pcVar8;
  cmInstallExportGenerator *this;
  pointer puVar9;
  cmTarget *pcVar10;
  cmExportBuildFileGenerator *pcVar11;
  pointer ppcVar12;
  pointer pTVar13;
  pointer puVar14;
  int iVar15;
  uint uVar16;
  cmFileSet *this_00;
  cmInstallFileSetGenerator *this_01;
  iterator iVar17;
  iterator iVar18;
  Value *pVVar19;
  Value *pVVar20;
  _Base_ptr p_Var21;
  cmInstallCxxModuleBmiGenerator *this_02;
  cmGlobalGenerator *pcVar22;
  _Rb_tree_header *p_Var23;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *pvVar24;
  string *psVar25;
  _Rb_tree_node_base *__k;
  _Base_ptr p_Var26;
  _Base_ptr p_Var27;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
  **ppmVar28;
  cmInstallCxxModuleBmiGenerator *pcVar29;
  pointer name;
  pointer_____offset_0x10___ *__x;
  undefined8 uVar30;
  char *value;
  _Alloc_hider _Var31;
  long lVar32;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  pointer puVar33;
  Comments *pCVar34;
  pointer pTVar35;
  pointer pTVar36;
  pointer puVar37;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig;
  ValueHolder VVar38;
  pointer ppcVar39;
  pointer pTVar40;
  pointer pTVar41;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  static_string_view sVar42;
  Value fs_dest;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files_per_dirs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> obj_path;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> cxxModuleSources;
  anon_class_24_3_20354611 fill_sf_map;
  string fs_type;
  string dest;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
  sf_map;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_file_sets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  
  pcVar2 = gt->Target;
  cmTarget::GetAllFileSetNames_abi_cxx11_(&all_file_sets,pcVar2);
  Json::Value::Value((Value *)&dest,objectValue);
  if (all_file_sets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      all_file_sets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var23 = &sf_map._M_t._M_impl.super__Rb_tree_header;
    name = all_file_sets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = cmTarget::GetFileSet(pcVar2,name);
      if (this_00 == (cmFileSet *)0x0) {
        pcVar8 = gt->Makefile;
        cmTarget::GetName_abi_cxx11_(pcVar2);
        fill_sf_map.gt = (cmGeneratorTarget *)0x8;
        fill_sf_map.tgt = (cmTarget *)0x7e7fd9;
        fill_sf_map.sf_map =
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
              *)0x0;
        views._M_len = 5;
        views._M_array = (iterator)&fill_sf_map;
        cmCatViews((string *)&files_per_dirs,views);
        cmMakefile::IssueMessage(pcVar8,INTERNAL_ERROR,(string *)&files_per_dirs);
        uVar30 = files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        _Var31._M_p = (pointer)files_per_dirs._M_t._M_impl._0_8_;
        if ((_Base_ptr *)files_per_dirs._M_t._M_impl._0_8_ !=
            &files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
        goto LAB_00382890;
      }
      else {
        fs_type._M_dataplus._M_p = (pointer)&fs_type.field_2;
        pcVar3 = (this_00->Type)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&fs_type,pcVar3,pcVar3 + (this_00->Type)._M_string_length);
        if ((fs_type._M_string_length == 0xb) &&
           (iVar15 = bcmp(fs_type._M_dataplus._M_p,"CXX_MODULES",0xb), iVar15 == 0)) {
          cmFileSet::CompileFileEntries(&fileEntries,this_00);
          cmFileSet::CompileDirectoryEntries(&directoryEntries,this_00);
          cmFileSet::EvaluateDirectoryEntries
                    (&directories,this_00,&directoryEntries,gt->LocalGenerator,config,gt,
                     (cmGeneratorExpressionDAGChecker *)0x0);
          puVar14 = fileEntries.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header;
          files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (cge = fileEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; cge != puVar14; cge = cge + 1) {
            cmFileSet::EvaluateFileEntry
                      (this_00,&directories,&files_per_dirs,cge,gt->LocalGenerator,config,gt,
                       (cmGeneratorExpressionDAGChecker *)0x0);
          }
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fill_sf_map.sf_map = &sf_map;
          fs_dest.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl =
               (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                  )0x0;
          fs_dest.value_.int_ = 0;
          fs_dest.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
          fs_dest._12_4_ = 0;
          fill_sf_map.gt = gt;
          fill_sf_map.tgt = pcVar2;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var23->_M_header;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var23->_M_header;
          cmGeneratorTarget::GetObjectSources
                    (gt,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &fs_dest,config);
          uVar30 = fs_dest._8_8_;
          for (VVar38 = fs_dest.value_; VVar38.int_ != uVar30;
              VVar38.string_ = (char *)&((VVar38.map_)->_M_t)._M_impl.super__Rb_tree_header) {
            anon_unknown.dwarf_1320734::CollationInformationCxxModules::anon_class_24_3_20354611::
            operator()(&fill_sf_map,*(cmSourceFile **)VVar38.string_,ObjectAndBmi);
          }
          cxxModuleSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          cxxModuleSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          cxxModuleSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmGeneratorTarget::GetCxxModuleSources(gt,&cxxModuleSources,config);
          ppcVar12 = cxxModuleSources.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar39 = cxxModuleSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppcVar39 != ppcVar12;
              ppcVar39 = ppcVar39 + 1) {
            anon_unknown.dwarf_1320734::CollationInformationCxxModules::anon_class_24_3_20354611::
            operator()(&fill_sf_map,*ppcVar39,BmiOnly);
          }
          if (cxxModuleSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(cxxModuleSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)cxxModuleSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)cxxModuleSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (fs_dest.value_.int_ != 0) {
            operator_delete(fs_dest.value_.string_,
                            (long)fs_dest.comments_.ptr_._M_t.
                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  .
                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                  ._M_head_impl - (long)fs_dest.value_);
          }
          __x = (pointer_____offset_0x10___ *)0x0;
          Json::Value::Value(&fs_dest,nullValue);
          puVar4 = (gt->Makefile->InstallGenerators).
                   super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar33 = (gt->Makefile->InstallGenerators).
                         super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar33 != puVar4;
              puVar33 = puVar33 + 1) {
            pcVar5 = (puVar33->_M_t).
                     super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                     .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
            if (pcVar5 == (cmInstallGenerator *)0x0) {
              this_01 = (cmInstallFileSetGenerator *)0x0;
            }
            else {
              __x = &cmInstallGenerator::typeinfo;
              this_01 = (cmInstallFileSetGenerator *)
                        __dynamic_cast(pcVar5,&cmInstallGenerator::typeinfo,
                                       &cmInstallFileSetGenerator::typeinfo,0);
            }
            if (((this_01 != (cmInstallFileSetGenerator *)0x0) && (this_01->Target == gt)) &&
               (this_01->FileSet == this_00)) {
              cmInstallFileSetGenerator::GetDestination((string *)&cxxModuleSources,this_01,config);
              Json::Value::Value((Value *)&fill_sf_map,(string *)&cxxModuleSources);
              __x = (pointer_____offset_0x10___ *)&fill_sf_map;
              Json::Value::operator=(&fs_dest,(Value *)&fill_sf_map);
              Json::Value::~Value((Value *)&fill_sf_map);
              if (cxxModuleSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&cxxModuleSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                __x = (pointer_____offset_0x10___ *)
                      ((long)cxxModuleSources.
                             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                operator_delete(cxxModuleSources.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,(ulong)__x);
              }
            }
          }
          if ((_Rb_tree_header *)files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left
              != &files_per_dirs._M_t._M_impl.super__Rb_tree_header) {
            p_Var21 = files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            do {
              p_Var27 = *(_Base_ptr *)&p_Var21[2]._M_color;
              p_Var6 = p_Var21[2]._M_parent;
              if (p_Var27 != p_Var6) {
                __k = p_Var21;
                do {
                  cmsys::SystemTools::CollapseFullPath
                            ((string *)&cxxModuleSources,(string *)p_Var27);
                  iVar17 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                                             *)sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent,(_Link_type)p_Var23,
                                            (_Base_ptr)&cxxModuleSources,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__k);
                  iVar18._M_node = &p_Var23->_M_header;
                  if (((_Rb_tree_header *)iVar17._M_node != p_Var23) &&
                     (iVar15 = std::__cxx11::string::compare((string *)&cxxModuleSources),
                     iVar18 = iVar17, iVar15 < 0)) {
                    iVar18._M_node = &p_Var23->_M_header;
                  }
                  if ((_Rb_tree_header *)iVar18._M_node == p_Var23) {
                    pcVar8 = gt->Makefile;
                    cmTarget::GetName_abi_cxx11_(pcVar2);
                    fill_sf_map.gt = (cmGeneratorTarget *)0x8;
                    fill_sf_map.tgt = (cmTarget *)0x7e7fd9;
                    fill_sf_map.sf_map =
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                          *)0x0;
                    __k = p_Var27->_M_parent;
                    views_00._M_len = 5;
                    views_00._M_array = (iterator)&fill_sf_map;
                    cmCatViews(&obj_path,views_00);
                    __x = (pointer_____offset_0x10___ *)0x2;
                    cmMakefile::IssueMessage(pcVar8,FATAL_ERROR,&obj_path);
                  }
                  else {
                    pcVar7 = *(cmGeneratorTarget **)(iVar18._M_node + 2);
                    if (pcVar7 == (cmGeneratorTarget *)0x0) {
                      pcVar8 = gt->Makefile;
                      cmTarget::GetName_abi_cxx11_(pcVar2);
                      fill_sf_map.gt = (cmGeneratorTarget *)0x8;
                      fill_sf_map.tgt = (cmTarget *)0x7e7fd9;
                      fill_sf_map.sf_map =
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                            *)0x0;
                      __k = p_Var27->_M_parent;
                      views_01._M_len = 5;
                      views_01._M_array = (iterator)&fill_sf_map;
                      cmCatViews(&obj_path,views_01);
                      __x = (pointer_____offset_0x10___ *)0x3;
                      cmMakefile::IssueMessage(pcVar8,INTERNAL_ERROR,&obj_path);
                    }
                    else {
                      iVar15 = *(int *)&iVar18._M_node[2]._M_parent;
                      fill_sf_map.gt = pcVar7;
                      if (iVar15 == 0) {
                        if ((cb->ObjectFilePath).super__Function_base._M_manager ==
                            (_Manager_type)0x0) goto LAB_003835f7;
                        (*(cb->ObjectFilePath)._M_invoker)
                                  (&obj_path,(_Any_data *)cb,(cmSourceFile **)&fill_sf_map,config);
                      }
                      else {
                        if ((cb->BmiFilePath).super__Function_base._M_manager == (_Manager_type)0x0)
                        {
LAB_003835f7:
                          std::__throw_bad_function_call();
                        }
                        (*(cb->BmiFilePath)._M_invoker)
                                  (&obj_path,(_Any_data *)&cb->BmiFilePath,
                                   (cmSourceFile **)&fill_sf_map,config);
                      }
                      Json::Value::Value((Value *)&fill_sf_map,objectValue);
                      pVVar19 = Json::Value::operator[]((Value *)&dest,&obj_path);
                      pVVar19 = Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      Json::Value::Value((Value *)&fill_sf_map,(String *)&cxxModuleSources);
                      pVVar20 = Json::Value::operator[](pVVar19,"source");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      Json::Value::Value((Value *)&fill_sf_map,iVar15 == 1);
                      pVVar20 = Json::Value::operator[](pVVar19,"bmi-only");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      Json::Value::Value((Value *)&fill_sf_map,(String *)(p_Var21 + 1));
                      pVVar20 = Json::Value::operator[](pVVar19,"relative-directory");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      Json::Value::Value((Value *)&fill_sf_map,&this_00->Name);
                      pVVar20 = Json::Value::operator[](pVVar19,"name");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      Json::Value::Value((Value *)&fill_sf_map,&this_00->Type);
                      pVVar20 = Json::Value::operator[](pVVar19,"type");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      sVar42 = cmFileSetVisibilityToName(this_00->Visibility);
                      __k = (_Rb_tree_node_base *)
                            &targets.
                             super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      targets.
                      super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)__k;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&targets,sVar42.super_string_view._M_str,
                                 sVar42.super_string_view._M_str + sVar42.super_string_view._M_len);
                      Json::Value::Value((Value *)&fill_sf_map,(String *)&targets);
                      pVVar20 = Json::Value::operator[](pVVar19,"visibility");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      if (targets.
                          super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&targets.
                                    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(targets.
                                        super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)&((targets.
                                                  super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->Name)._M_dataplus._M_p + 1));
                      }
                      pVVar19 = Json::Value::operator[](pVVar19,"destination");
                      __x = (pointer_____offset_0x10___ *)&fs_dest;
                      Json::Value::operator=(pVVar19,(Value *)__x);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)obj_path._M_dataplus._M_p != &obj_path.field_2) {
                    __x = (pointer_____offset_0x10___ *)(obj_path.field_2._M_allocated_capacity + 1)
                    ;
                    operator_delete(obj_path._M_dataplus._M_p,(ulong)__x);
                  }
                  if (cxxModuleSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (pointer)&cxxModuleSources.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    __x = (pointer_____offset_0x10___ *)
                          ((long)cxxModuleSources.
                                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                    operator_delete(cxxModuleSources.
                                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,(ulong)__x);
                  }
                  p_Var27 = p_Var27 + 1;
                } while (p_Var27 != p_Var6);
              }
              p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
            } while ((_Rb_tree_header *)p_Var21 !=
                     &files_per_dirs._M_t._M_impl.super__Rb_tree_header);
          }
          Json::Value::~Value(&fs_dest);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                      *)sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Link_type)__x);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&files_per_dirs._M_t);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&directories);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&directoryEntries);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&fileEntries);
        }
        uVar30 = fs_type.field_2._M_allocated_capacity;
        _Var31._M_p = fs_type._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
LAB_00382890:
          operator_delete(_Var31._M_p,(ulong)((long)&((_Base_ptr)uVar30)->_M_color + 1));
        }
      }
      name = name + 1;
    } while (name != all_file_sets.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&all_file_sets);
  pVVar19 = Json::Value::operator[](tdi,"cxx-modules");
  Json::Value::operator=(pVVar19,(Value *)&dest);
  Json::Value::~Value((Value *)&dest);
  puVar33 = (gt->Makefile->InstallGenerators).
            super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (gt->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar33 == puVar4) {
    this_02 = (cmInstallCxxModuleBmiGenerator *)0x0;
  }
  else {
    pcVar29 = (cmInstallCxxModuleBmiGenerator *)0x0;
    do {
      pcVar5 = (puVar33->_M_t).
               super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
               .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
      if (pcVar5 == (cmInstallGenerator *)0x0) {
        this_02 = (cmInstallCxxModuleBmiGenerator *)0x0;
      }
      else {
        this_02 = (cmInstallCxxModuleBmiGenerator *)
                  __dynamic_cast(pcVar5,&cmInstallGenerator::typeinfo,
                                 &cmInstallCxxModuleBmiGenerator::typeinfo,0);
      }
      if ((this_02 == (cmInstallCxxModuleBmiGenerator *)0x0) || (this_02->Target != gt)) {
        this_02 = pcVar29;
      }
      puVar33 = puVar33 + 1;
      pcVar29 = this_02;
    } while (puVar33 != puVar4);
  }
  if (this_02 == (cmInstallCxxModuleBmiGenerator *)0x0) {
    Json::Value::Value((Value *)&files_per_dirs,nullValue);
  }
  else {
    Json::Value::Value((Value *)&files_per_dirs,objectValue);
    Json::Value::Value((Value *)&fill_sf_map,&this_02->FilePermissions);
    pVVar19 = Json::Value::operator[]((Value *)&files_per_dirs,"permissions");
    Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
    Json::Value::~Value((Value *)&fill_sf_map);
    cmInstallCxxModuleBmiGenerator::GetDestination((string *)&sf_map,this_02,config);
    Json::Value::Value((Value *)&fill_sf_map,(String *)&sf_map);
    pVVar19 = Json::Value::operator[]((Value *)&files_per_dirs,"destination");
    Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
    Json::Value::~Value((Value *)&fill_sf_map);
    pp_Var1 = &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                      (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    uVar16 = (this_02->super_cmInstallGenerator).Message - MessageAlways;
    if (uVar16 < 3) {
      value = &DAT_007e93dc + *(int *)(&DAT_007e93dc + (ulong)uVar16 * 4);
    }
    else {
      value = "";
    }
    Json::Value::Value((Value *)&fill_sf_map,value);
    pVVar19 = Json::Value::operator[]((Value *)&files_per_dirs,"message-level");
    Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
    Json::Value::~Value((Value *)&fill_sf_map);
    cmInstallCxxModuleBmiGenerator::GetScriptLocation((string *)&sf_map,this_02,config);
    Json::Value::Value((Value *)&fill_sf_map,(String *)&sf_map);
    pVVar19 = Json::Value::operator[]((Value *)&files_per_dirs,"script-location");
    Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
    Json::Value::~Value((Value *)&fill_sf_map);
    if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                      (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
  }
  pVVar19 = Json::Value::operator[](tdi,"bmi-installation");
  Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
  Json::Value::~Value((Value *)&files_per_dirs);
  Json::Value::Value((Value *)&sf_map,arrayValue);
  cmGeneratorTarget::GetExportName_abi_cxx11_((string *)&cxxModuleSources,gt);
  pcVar22 = cmGeneratorTarget::GetGlobalGenerator(gt);
  p_Var21 = (pcVar22->ExportSets).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var23 = &(pcVar22->ExportSets).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
             ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var21 != p_Var23) {
    do {
      p_Var27 = *(_Base_ptr *)(p_Var21 + 2);
      p_Var6 = p_Var21[2]._M_parent;
      lVar32 = (long)p_Var6 - (long)p_Var27 >> 5;
      p_Var26 = p_Var27;
      if (0 < lVar32) {
        p_Var26 = (_Base_ptr)
                  ((long)&p_Var27->_M_color + ((long)p_Var6 - (long)p_Var27 & 0xffffffffffffffe0U));
        lVar32 = lVar32 + 1;
        p_Var27 = (_Base_ptr)&p_Var27->_M_left;
        do {
          if (*(cmGeneratorTarget **)(p_Var27[-1]._M_left + 1) == gt) {
            p_Var27 = (_Base_ptr)&p_Var27[-1]._M_left;
            goto LAB_00382c83;
          }
          if (*(cmGeneratorTarget **)(p_Var27[-1]._M_right + 1) == gt) {
            p_Var27 = (_Base_ptr)&p_Var27[-1]._M_right;
            goto LAB_00382c83;
          }
          if (*(cmGeneratorTarget **)(*(long *)p_Var27 + 0x20) == gt) goto LAB_00382c83;
          if (*(cmGeneratorTarget **)(p_Var27->_M_parent + 1) == gt) {
            p_Var27 = (_Base_ptr)&p_Var27->_M_parent;
            goto LAB_00382c83;
          }
          lVar32 = lVar32 + -1;
          p_Var27 = p_Var27 + 1;
        } while (1 < lVar32);
      }
      lVar32 = (long)p_Var6 - (long)p_Var26 >> 3;
      if (lVar32 == 1) {
LAB_00382c5e:
        p_Var27 = p_Var26;
        if (*(cmGeneratorTarget **)(*(long *)p_Var26 + 0x20) != gt) {
          p_Var27 = p_Var6;
        }
      }
      else if (lVar32 == 2) {
LAB_00382c4c:
        p_Var27 = p_Var26;
        if (*(cmGeneratorTarget **)(*(long *)p_Var26 + 0x20) != gt) {
          p_Var26 = (_Base_ptr)&p_Var26->_M_parent;
          goto LAB_00382c5e;
        }
      }
      else {
        p_Var27 = p_Var6;
        if ((lVar32 == 3) &&
           (p_Var27 = p_Var26, *(cmGeneratorTarget **)(*(long *)p_Var26 + 0x20) != gt)) {
          p_Var26 = (_Base_ptr)&p_Var26->_M_parent;
          goto LAB_00382c4c;
        }
      }
LAB_00382c83:
      if (p_Var27 != p_Var6) {
        p_Var6 = *(_Base_ptr *)(p_Var21 + 4);
        for (p_Var27 = p_Var21[3]._M_right; p_Var27 != p_Var6;
            p_Var27 = (_Base_ptr)&p_Var27->_M_parent) {
          this = *(cmInstallExportGenerator **)p_Var27;
          Json::Value::Value((Value *)&fill_sf_map,objectValue);
          fs_dest.value_.string_ = (char *)&fs_dest.comments_;
          pcVar3 = (this->CxxModulesDirectory)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&fs_dest,pcVar3,pcVar3 + (this->CxxModulesDirectory)._M_string_length
                    );
          cmInstallExportGenerator::GetTempDir_abi_cxx11_(&dest,this);
          Json::Value::Value((Value *)&files_per_dirs,&this->Namespace);
          pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"namespace");
          Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
          Json::Value::~Value((Value *)&files_per_dirs);
          Json::Value::Value((Value *)&files_per_dirs,(String *)&cxxModuleSources);
          pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"export-name");
          Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
          Json::Value::~Value((Value *)&files_per_dirs);
          Json::Value::Value((Value *)&files_per_dirs,&(this->super_cmInstallGenerator).Destination)
          ;
          pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"destination");
          Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
          Json::Value::~Value((Value *)&files_per_dirs);
          Json::Value::Value((Value *)&files_per_dirs,(String *)&fs_dest);
          pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"cxx-module-info-dir");
          Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
          Json::Value::~Value((Value *)&files_per_dirs);
          Json::Value::Value((Value *)&files_per_dirs,&dest);
          pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"export-prefix");
          Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
          Json::Value::~Value((Value *)&files_per_dirs);
          Json::Value::Value((Value *)&files_per_dirs,true);
          pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"install");
          Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
          Json::Value::~Value((Value *)&files_per_dirs);
          Json::Value::append((Value *)&sf_map,(Value *)&fill_sf_map);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dest._M_dataplus._M_p != &dest.field_2) {
            operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
          }
          if (fs_dest.value_ != &fs_dest.comments_) {
            operator_delete(fs_dest.value_.string_,
                            (long)fs_dest.comments_.ptr_._M_t.
                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  .
                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                  ._M_head_impl + 1);
          }
          Json::Value::~Value((Value *)&fill_sf_map);
        }
      }
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
    } while ((_Rb_tree_header *)p_Var21 != p_Var23);
  }
  pvVar24 = cmMakefile::GetExportBuildFileGenerators(gt->Makefile);
  puVar37 = (pvVar24->
            super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (pvVar24->
           super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar37 == puVar9) {
      if (cxxModuleSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&cxxModuleSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(cxxModuleSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)cxxModuleSources.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      pVVar19 = Json::Value::operator[](tdi,"exports");
      Json::Value::operator=(pVVar19,(Value *)&sf_map);
      Json::Value::~Value((Value *)&sf_map);
      Json::Value::Value((Value *)&fill_sf_map,config);
      pVVar19 = Json::Value::operator[](tdi,"config");
      Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
      Json::Value::~Value((Value *)&fill_sf_map);
      return;
    }
    ppmVar28 = &fill_sf_map.sf_map;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmExportBuildFileGenerator::GetTargets
              ((puVar37->_M_t).
               super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
               .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl,&targets);
    psVar25 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
    pTVar13 = targets.
              super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pTVar40 = targets.
              super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
              ._M_impl.super__Vector_impl_data._M_start;
    obj_path._M_dataplus._M_p = (pointer)&obj_path.field_2;
    pcVar3 = (psVar25->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&obj_path,pcVar3,pcVar3 + psVar25->_M_string_length);
    fs_type._M_dataplus._M_p = (pointer)&fs_type.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_type,obj_path._M_dataplus._M_p,
               obj_path._M_dataplus._M_p + obj_path._M_string_length);
    dest._M_dataplus._M_p = (pointer)&dest.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&dest,fs_type._M_dataplus._M_p,
               fs_type._M_dataplus._M_p + fs_type._M_string_length);
    fs_dest.value_ = (ValueHolder)&fs_dest.comments_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_dest,dest._M_dataplus._M_p,
               dest._M_dataplus._M_p + dest._M_string_length);
    fill_sf_map.gt = (cmGeneratorTarget *)ppmVar28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fill_sf_map,fs_dest.value_.int_,fs_dest.value_.string_ + fs_dest._8_8_);
    files_per_dirs._M_t._M_impl._0_8_ =
         &files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&files_per_dirs,fill_sf_map.gt,
               (long)&(fill_sf_map.gt)->Target + (long)&(fill_sf_map.tgt)->impl);
    if (fill_sf_map.gt != (cmGeneratorTarget *)ppmVar28) {
      operator_delete(fill_sf_map.gt,(ulong)&((fill_sf_map.sf_map)->_M_t)._M_impl.field_0x1);
    }
    fill_sf_map.gt = (cmGeneratorTarget *)ppmVar28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fill_sf_map,files_per_dirs._M_t._M_impl._0_8_,
               CONCAT44(files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                        files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
               files_per_dirs._M_t._M_impl._0_8_);
    pcVar2 = fill_sf_map.tgt;
    pcVar7 = fill_sf_map.gt;
    lVar32 = (long)pTVar13 - (long)pTVar40 >> 8;
    pTVar41 = pTVar40;
    if (0 < lVar32) {
      pTVar41 = (pointer)((long)&(pTVar40->Name)._M_dataplus._M_p +
                         ((long)pTVar13 - (long)pTVar40 & 0xffffffffffffff00U));
      lVar32 = lVar32 + 1;
      pTVar35 = pTVar40 + 2;
      do {
        pcVar10 = (cmTarget *)pTVar35[-2].Name._M_string_length;
        if (pcVar10 == pcVar2) {
          if (pcVar10 == (cmTarget *)0x0) {
            pTVar36 = pTVar35 + -2;
            goto LAB_00383226;
          }
          iVar15 = bcmp(pTVar35[-2].Name._M_dataplus._M_p,pcVar7,(size_t)pcVar10);
          pTVar36 = pTVar40;
          if (iVar15 == 0) goto LAB_00383226;
        }
        pcVar10 = (cmTarget *)pTVar35[-1].Name._M_string_length;
        if (pcVar10 == pcVar2) {
          if (pcVar10 == (cmTarget *)0x0) {
            pTVar36 = pTVar40 + 1;
            goto LAB_00383226;
          }
          iVar15 = bcmp(pTVar35[-1].Name._M_dataplus._M_p,pcVar7,(size_t)pcVar10);
          if (iVar15 == 0) {
            pTVar36 = pTVar35 + -1;
            goto LAB_00383226;
          }
        }
        pcVar10 = (cmTarget *)(pTVar35->Name)._M_string_length;
        if (pcVar10 == pcVar2) {
          pTVar36 = pTVar35;
          if (pcVar10 == (cmTarget *)0x0) goto LAB_00383226;
          iVar15 = bcmp((pTVar35->Name)._M_dataplus._M_p,pcVar7,(size_t)pcVar10);
          if (iVar15 == 0) {
            pTVar36 = pTVar40 + 2;
            goto LAB_00383226;
          }
        }
        pcVar10 = (cmTarget *)pTVar35[1].Name._M_string_length;
        if (pcVar10 == pcVar2) {
          if (pcVar10 == (cmTarget *)0x0) {
            pTVar36 = pTVar40 + 3;
            goto LAB_00383226;
          }
          iVar15 = bcmp(pTVar35[1].Name._M_dataplus._M_p,pcVar7,(size_t)pcVar10);
          if (iVar15 == 0) {
            pTVar36 = pTVar35 + 1;
            goto LAB_00383226;
          }
        }
        pTVar40 = pTVar40 + 4;
        lVar32 = lVar32 + -1;
        pTVar35 = pTVar35 + 4;
      } while (1 < lVar32);
    }
    lVar32 = (long)pTVar13 - (long)pTVar41 >> 6;
    if (lVar32 == 1) {
LAB_003831b9:
      pcVar2 = (cmTarget *)(pTVar41->Name)._M_string_length;
      pTVar36 = pTVar13;
      if (((pcVar2 == fill_sf_map.tgt) && (pTVar36 = pTVar41, pcVar2 != (cmTarget *)0x0)) &&
         (iVar15 = bcmp((pTVar41->Name)._M_dataplus._M_p,fill_sf_map.gt,(size_t)pcVar2), iVar15 != 0
         )) {
        pTVar36 = pTVar13;
      }
    }
    else if (lVar32 == 2) {
LAB_0038318e:
      pcVar2 = (cmTarget *)(pTVar41->Name)._M_string_length;
      if ((pcVar2 != fill_sf_map.tgt) ||
         ((pTVar36 = pTVar41, pcVar2 != (cmTarget *)0x0 &&
          (iVar15 = bcmp((pTVar41->Name)._M_dataplus._M_p,fill_sf_map.gt,(size_t)pcVar2),
          iVar15 != 0)))) {
        pTVar41 = pTVar41 + 1;
        goto LAB_003831b9;
      }
    }
    else {
      pTVar36 = pTVar13;
      if ((lVar32 == 3) &&
         ((pcVar2 = (cmTarget *)(pTVar41->Name)._M_string_length, pcVar2 != fill_sf_map.tgt ||
          ((pTVar36 = pTVar41, pcVar2 != (cmTarget *)0x0 &&
           (iVar15 = bcmp((pTVar41->Name)._M_dataplus._M_p,fill_sf_map.gt,(size_t)pcVar2),
           iVar15 != 0)))))) {
        pTVar41 = pTVar41 + 1;
        goto LAB_0038318e;
      }
    }
LAB_00383226:
    pCVar34 = &fs_dest.comments_;
    if (fill_sf_map.gt != (cmGeneratorTarget *)&fill_sf_map.sf_map) {
      operator_delete(fill_sf_map.gt,(ulong)&((fill_sf_map.sf_map)->_M_t)._M_impl.field_0x1);
    }
    if ((_Base_ptr *)files_per_dirs._M_t._M_impl._0_8_ !=
        &files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)files_per_dirs._M_t._M_impl._0_8_,
                      (ulong)((long)&(files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if (fs_dest.value_ != pCVar34) {
      operator_delete(fs_dest.value_.string_,
                      (long)fs_dest.comments_.ptr_._M_t.
                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dest._M_dataplus._M_p != &dest.field_2) {
      operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
      operator_delete(fs_type._M_dataplus._M_p,fs_type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_path._M_dataplus._M_p != &obj_path.field_2) {
      operator_delete(obj_path._M_dataplus._M_p,obj_path.field_2._M_allocated_capacity + 1);
    }
    if (pTVar36 != pTVar13) {
      Json::Value::Value((Value *)&fill_sf_map,objectValue);
      pcVar11 = (puVar37->_M_t).
                super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl;
      _Var31._M_p = (pcVar11->super_cmExportFileGenerator).Namespace._M_dataplus._M_p;
      fs_dest.value_ = (ValueHolder)pCVar34;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fs_dest,_Var31._M_p,
                 _Var31._M_p +
                 *(size_type *)((long)&(pcVar11->super_cmExportFileGenerator).Namespace + 8));
      psVar25 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar37->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      pcVar11 = (puVar37->_M_t).
                super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl;
      cmsys::SystemTools::GetParentDirectory(&dest,psVar25);
      psVar25 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar37->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      cmsys::SystemTools::GetFilenamePath(&fs_type,psVar25);
      Json::Value::Value((Value *)&files_per_dirs,(String *)&fs_dest);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"namespace");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::Value((Value *)&files_per_dirs,(String *)&cxxModuleSources);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"export-name");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::Value((Value *)&files_per_dirs,&dest);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"destination");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::Value((Value *)&files_per_dirs,&pcVar11->CxxModulesDirectory);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"cxx-module-info-dir");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::Value((Value *)&files_per_dirs,&fs_type);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"export-prefix");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::Value((Value *)&files_per_dirs,false);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"install");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::append((Value *)&sf_map,(Value *)&fill_sf_map);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
        operator_delete(fs_type._M_dataplus._M_p,fs_type.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dest._M_dataplus._M_p != &dest.field_2) {
        operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
      }
      if (fs_dest.value_ != pCVar34) {
        operator_delete(fs_dest.value_.string_,
                        (long)fs_dest.comments_.ptr_._M_t.
                              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              .
                              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                              ._M_head_impl + 1);
      }
      Json::Value::~Value((Value *)&fill_sf_map);
    }
    std::
    vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ::~vector(&targets);
    puVar37 = puVar37 + 1;
  } while( true );
}

Assistant:

void cmDyndepCollation::AddCollationInformation(
  Json::Value& tdi, cmGeneratorTarget const* gt, std::string const& config,
  cmDyndepGeneratorCallbacks const& cb)
{
  tdi["cxx-modules"] = CollationInformationCxxModules(gt, config, cb);
  tdi["bmi-installation"] = CollationInformationBmiInstallation(gt, config);
  tdi["exports"] = CollationInformationExports(gt);
  tdi["config"] = config;
}